

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O1

Error __thiscall asmjit::X86Assembler::align(X86Assembler *this,uint32_t mode,uint32_t alignment)

{
  Error EVar1;
  int __c;
  long lVar2;
  uint8_t *puVar3;
  uint uVar4;
  uint8_t *puVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  float in_XMM0_Da;
  
  if (((this->super_Assembler).super_CodeEmitter._globalOptions & 4) != 0) {
    Logger::logf(((this->super_Assembler).super_CodeEmitter._code)->_logger,in_XMM0_Da);
  }
  if (2 < mode) {
LAB_0016f929:
    EVar1 = CodeEmitter::setLastError((CodeEmitter *)this,3,(char *)0x0);
    return EVar1;
  }
  EVar1 = 0;
  if (1 < alignment) {
    if (0x40 < alignment || (alignment - 1 & alignment) != 0) goto LAB_0016f929;
    puVar3 = (this->super_Assembler)._bufferPtr;
    lVar2 = (long)puVar3 - (long)(this->super_Assembler)._bufferData;
    uVar8 = (-(ulong)alignment & (ulong)(alignment - 1) + lVar2) - lVar2;
    uVar6 = (uint)uVar8;
    if (uVar6 != 0) {
      if (((ulong)((long)(this->super_Assembler)._bufferEnd - (long)puVar3) < (uVar8 & 0xffffffff))
         && (EVar1 = CodeHolder::growBuffer
                               ((this->super_Assembler).super_CodeEmitter._code,
                                &((this->super_Assembler)._section)->_buffer,uVar8 & 0xffffffff),
            EVar1 != 0)) {
        EVar1 = CodeEmitter::setLastError((CodeEmitter *)this,EVar1,(char *)0x0);
      }
      else {
        puVar3 = (this->super_Assembler)._bufferPtr;
        if (mode == 1) {
          __c = 0xcc;
        }
        else if (mode == 0) {
          __c = 0x90;
          if (((this->super_Assembler).super_CodeEmitter._globalHints & 1) != 0) {
            do {
              puVar5 = puVar3;
              uVar7 = (uint)uVar8;
              uVar6 = 9;
              if (uVar7 < 9) {
                uVar6 = uVar7;
              }
              uVar4 = uVar7;
              if (8 < (uVar8 & 0xffffffff)) {
                uVar4 = 9;
              }
              lVar2 = 0;
              do {
                puVar5[lVar2] = align::nopData[uVar6 - 1][lVar2];
                lVar2 = lVar2 + 1;
              } while (uVar4 != (uint)lVar2);
              uVar8 = (ulong)(uVar7 - uVar6);
              puVar3 = puVar5 + lVar2;
            } while (uVar7 - uVar6 != 0);
            puVar3 = puVar5 + lVar2;
            uVar6 = 0;
          }
        }
        else {
          __c = 0;
        }
        if (uVar6 != 0) {
          memset(puVar3,__c,(ulong)uVar6);
          puVar3 = puVar3 + uVar6;
        }
        (this->super_Assembler)._bufferPtr = puVar3;
        EVar1 = 0;
      }
    }
  }
  return EVar1;
}

Assistant:

Error X86Assembler::align(uint32_t mode, uint32_t alignment) {
#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled)
    _code->_logger->logf("%s.align %u\n", _code->_logger->getIndentation(), alignment);
#endif // !ASMJIT_DISABLE_LOGGING

  if (mode >= kAlignCount)
    return setLastError(DebugUtils::errored(kErrorInvalidArgument));

  if (alignment <= 1)
    return kErrorOk;

  if (!Utils::isPowerOf2(alignment) || alignment > Globals::kMaxAlignment)
    return setLastError(DebugUtils::errored(kErrorInvalidArgument));

  uint32_t i = static_cast<uint32_t>(Utils::alignDiff<size_t>(getOffset(), alignment));
  if (i == 0)
    return kErrorOk;

  if (getRemainingSpace() < i) {
    Error err = _code->growBuffer(&_section->_buffer, i);
    if (ASMJIT_UNLIKELY(err)) return setLastError(err);
  }

  uint8_t* cursor = _bufferPtr;
  uint8_t pattern = 0x00;

  switch (mode) {
    case kAlignCode: {
      if (_globalHints & kHintOptimizedAlign) {
        // Intel 64 and IA-32 Architectures Software Developer's Manual - Volume 2B (NOP).
        enum { kMaxNopSize = 9 };

        static const uint8_t nopData[kMaxNopSize][kMaxNopSize] = {
          { 0x90 },
          { 0x66, 0x90 },
          { 0x0F, 0x1F, 0x00 },
          { 0x0F, 0x1F, 0x40, 0x00 },
          { 0x0F, 0x1F, 0x44, 0x00, 0x00 },
          { 0x66, 0x0F, 0x1F, 0x44, 0x00, 0x00 },
          { 0x0F, 0x1F, 0x80, 0x00, 0x00, 0x00, 0x00 },
          { 0x0F, 0x1F, 0x84, 0x00, 0x00, 0x00, 0x00, 0x00 },
          { 0x66, 0x0F, 0x1F, 0x84, 0x00, 0x00, 0x00, 0x00, 0x00 }
        };

        do {
          uint32_t n = std::min<uint32_t>(i, kMaxNopSize);
          const uint8_t* src = nopData[n - 1];

          i -= n;
          do {
            EMIT_BYTE(*src++);
          } while (--n);
        } while (i);
      }

      pattern = 0x90;
      break;
    }

    case kAlignData:
      pattern = 0xCC;
      break;

    case kAlignZero:
      // Pattern already set to zero.
      break;
  }

  while (i) {
    EMIT_BYTE(pattern);
    i--;
  }

  _bufferPtr = cursor;
  return kErrorOk;
}